

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeSSBOBlockTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::logProgramInfo
               (NegativeTestContext *ctx,GLint program)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  GLint maxLength;
  string message;
  vector<char,_std::allocator<char>_> infoLog;
  string programLogMessage;
  GLint local_204;
  char *local_200;
  char *local_1f8;
  char local_1f0;
  undefined7 uStack_1ef;
  vector<char,_std::allocator<char>_> local_1e0;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  local_204 = 0;
  local_1f8 = (char *)0x0;
  local_1f0 = '\0';
  pTVar2 = (ctx->super_CallLogWrapper).m_log;
  local_200 = &local_1f0;
  glu::CallLogWrapper::glGetProgramiv(&ctx->super_CallLogWrapper,program,0x8b84,&local_204);
  std::__cxx11::string::_M_replace((ulong)&local_200,0,local_1f8,0x1c93a4e);
  poVar1 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_200,(long)local_1f8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_130);
  if ((long)local_204 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_200,0,local_1f8,0x1c93a5b);
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_200,(long)local_1f8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
  }
  else {
    std::vector<char,_std::allocator<char>_>::vector
              (&local_1e0,(long)local_204,(allocator_type *)local_1a8);
    glu::CallLogWrapper::glGetProgramInfoLog
              (&ctx->super_CallLogWrapper,program,local_204,&local_204,
               local_1e0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    local_1c8 = local_1b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c8,
               local_1e0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_1e0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + local_204);
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(char *)local_1c8,local_1c0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    if (local_1e0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (GLchar *)0x0) {
      operator_delete(local_1e0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1e0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,CONCAT71(uStack_1ef,local_1f0) + 1);
  }
  return;
}

Assistant:

void logProgramInfo(NegativeTestContext& ctx, GLint program)
{
	GLint			maxLength	=	0;
	std::string		message;
	tcu::TestLog&	log			=	ctx.getLog();

	ctx.glGetProgramiv(program, GL_INFO_LOG_LENGTH, &maxLength);

	message = "Program log:";
	log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

	if (maxLength == 0)
	{
		message = "No available info log.";
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		return;
	}

	std::vector<GLchar> infoLog(maxLength);
	ctx.glGetProgramInfoLog(program, maxLength, &maxLength, &infoLog[0]);

	std::string programLogMessage(&infoLog[0], maxLength);
	log << tcu::TestLog::Message << programLogMessage << tcu::TestLog::EndMessage;
}